

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> * __thiscall
Catch::ExprLhs<unsigned_long_const&>::operator<=
          (BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *__return_storage_ptr__,
          ExprLhs<unsigned_long_const&> *this,unsigned_long *rhs)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long *lhs;
  StringRef local_30;
  unsigned_long *local_20;
  unsigned_long *rhs_local;
  ExprLhs<const_unsigned_long_&> *this_local;
  
  uVar1 = **(ulong **)this;
  uVar2 = *rhs;
  lhs = *(unsigned_long **)this;
  local_20 = rhs;
  rhs_local = (unsigned_long *)this;
  this_local = (ExprLhs<const_unsigned_long_&> *)__return_storage_ptr__;
  StringRef::StringRef(&local_30,"<=");
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::BinaryExpr
            (__return_storage_ptr__,uVar1 <= uVar2,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }